

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O3

int Lf_ManComputeCrossCut(Gia_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  uint *puVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  int *piVar13;
  int iVar15;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int iVar20;
  long lVar17;
  
  auVar5 = _DAT_0093d220;
  if (p->pMuxes != (uint *)0x0) {
    __assert_fail("p->pMuxes == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                  ,0xe6,"int Lf_ManComputeCrossCut(Gia_Man_t *)");
  }
  uVar1 = p->nObjs;
  uVar6 = (ulong)uVar1;
  uVar8 = 0;
  if (0 < (int)uVar1) {
    pGVar3 = p->pObjs;
    if (pGVar3 != (Gia_Obj_t *)0x0) {
      lVar9 = uVar6 - 1;
      auVar14._8_4_ = (int)lVar9;
      auVar14._0_8_ = lVar9;
      auVar14._12_4_ = (int)((ulong)lVar9 >> 0x20);
      lVar9 = 0;
      auVar14 = auVar14 ^ _DAT_0093d220;
      auVar16 = _DAT_0093e4e0;
      auVar18 = _DAT_0093d210;
      do {
        auVar19 = auVar18 ^ auVar5;
        iVar15 = auVar14._4_4_;
        if ((bool)(~(auVar19._4_4_ == iVar15 && auVar14._0_4_ < auVar19._0_4_ ||
                    iVar15 < auVar19._4_4_) & 1)) {
          *(undefined4 *)((long)&pGVar3->Value + lVar9) = 0;
        }
        if ((auVar19._12_4_ != auVar14._12_4_ || auVar19._8_4_ <= auVar14._8_4_) &&
            auVar19._12_4_ <= auVar14._12_4_) {
          *(undefined4 *)((long)&pGVar3[1].Value + lVar9) = 0;
        }
        auVar19 = auVar16 ^ auVar5;
        iVar20 = auVar19._4_4_;
        if (iVar20 <= iVar15 && (iVar20 != iVar15 || auVar19._0_4_ <= auVar14._0_4_)) {
          *(undefined4 *)((long)&pGVar3[2].Value + lVar9) = 0;
          *(undefined4 *)((long)&pGVar3[3].Value + lVar9) = 0;
        }
        lVar17 = auVar18._8_8_;
        auVar18._0_8_ = auVar18._0_8_ + 4;
        auVar18._8_8_ = lVar17 + 4;
        lVar17 = auVar16._8_8_;
        auVar16._0_8_ = auVar16._0_8_ + 4;
        auVar16._8_8_ = lVar17 + 4;
        lVar9 = lVar9 + 0x30;
      } while ((ulong)(uVar1 + 3 >> 2) * 0x30 != lVar9);
      if ((int)uVar1 < 1) {
        uVar8 = 0;
        goto LAB_00764a25;
      }
    }
    if (p->pObjs != (Gia_Obj_t *)0x0) {
      puVar7 = &p->pObjs->Value;
      uVar10 = uVar6;
      do {
        uVar4 = *(ulong *)(puVar7 + -2);
        if ((uVar4 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar4) {
          iVar15 = (int)(uVar4 & 0x1fffffff);
          uVar8 = *(uint *)((long)puVar7 + (ulong)(uint)(iVar15 * 4) * -3 + -8);
          if ((~uVar8 & 0x1fffffff) != 0 && -1 < (int)uVar8) {
            piVar13 = (int *)((long)puVar7 + (ulong)(uint)(iVar15 << 2) * -3);
            *piVar13 = *piVar13 + 1;
          }
          uVar11 = (uint)(uVar4 >> 0x20) & 0x1fffffff;
          uVar8 = *(uint *)((long)puVar7 + (ulong)(uVar11 * 4) * -3 + -8);
          if ((~uVar8 & 0x1fffffff) != 0 && -1 < (int)uVar8) {
            piVar13 = (int *)((long)puVar7 + (ulong)(uVar11 << 2) * -3);
            *piVar13 = *piVar13 + 1;
          }
        }
        puVar7 = puVar7 + 3;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
      uVar8 = 0;
      if ((int)uVar1 < 1) goto LAB_00764a25;
    }
    pGVar3 = p->pObjs;
    puVar7 = &pGVar3->Value;
    uVar11 = 0;
    uVar8 = 0;
    uVar10 = uVar6;
    do {
      if (pGVar3 == (Gia_Obj_t *)0x0) {
        uVar8 = 0;
        goto LAB_007649fa;
      }
      uVar4 = *(ulong *)(puVar7 + -2);
      if ((uVar4 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar4) {
        uVar11 = (uVar11 + 1) - (uint)(*puVar7 == 0);
        if ((int)uVar8 <= (int)uVar11) {
          uVar8 = uVar11;
        }
        iVar15 = (int)(uVar4 & 0x1fffffff);
        uVar2 = *(uint *)((long)puVar7 + (ulong)(uint)(iVar15 * 4) * -3 + -8);
        if ((~uVar2 & 0x1fffffff) != 0 && -1 < (int)uVar2) {
          piVar13 = (int *)((long)puVar7 + (ulong)(uint)(iVar15 << 2) * -3);
          *piVar13 = *piVar13 + -1;
          uVar11 = uVar11 - (*piVar13 == 0);
        }
        uVar12 = (uint)(uVar4 >> 0x20) & 0x1fffffff;
        uVar2 = *(uint *)((long)puVar7 + (ulong)(uVar12 * 4) * -3 + -8);
        if ((~uVar2 & 0x1fffffff) != 0 && -1 < (int)uVar2) {
          piVar13 = (int *)((long)puVar7 + (ulong)(uVar12 << 2) * -3);
          *piVar13 = *piVar13 + -1;
          uVar11 = uVar11 - (*piVar13 == 0);
        }
      }
      puVar7 = puVar7 + 3;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
    if (uVar11 != 0) {
      __assert_fail("nCutCur == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                    ,0xfb,"int Lf_ManComputeCrossCut(Gia_Man_t *)");
    }
LAB_007649fa:
    if ((0 < (int)uVar1) && (p->pObjs != (Gia_Obj_t *)0x0)) {
      lVar9 = 0;
      do {
        if (*(int *)((long)&p->pObjs->Value + lVar9) != 0) {
          __assert_fail("pObj->Value == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                        ,0xff,"int Lf_ManComputeCrossCut(Gia_Man_t *)");
        }
        lVar9 = lVar9 + 0xc;
      } while (uVar6 * 0xc != lVar9);
    }
  }
LAB_00764a25:
  printf("CutMax = %d\n",(ulong)uVar8);
  return uVar8;
}

Assistant:

int Lf_ManComputeCrossCut( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, nCutMax = 0, nCutCur = 0;
    assert( p->pMuxes == NULL );
    Gia_ManForEachObj( p, pObj, i )
        pObj->Value = 0;
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) )
            Gia_ObjFanin0(pObj)->Value++;
        if ( Gia_ObjIsAnd(Gia_ObjFanin1(pObj)) )
            Gia_ObjFanin1(pObj)->Value++;
    }
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( pObj->Value )
            nCutCur++;
        if ( nCutMax < nCutCur )
            nCutMax = nCutCur;
        if ( Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) && --Gia_ObjFanin0(pObj)->Value == 0 )
            nCutCur--;
        if ( Gia_ObjIsAnd(Gia_ObjFanin1(pObj)) && --Gia_ObjFanin1(pObj)->Value == 0 )
            nCutCur--;
    }
    assert( nCutCur == 0 );
    if ( nCutCur )
        printf( "Cutset is not 0\n" );
    Gia_ManForEachObj( p, pObj, i )
        assert( pObj->Value == 0 );
    printf( "CutMax = %d\n", nCutMax );
    return nCutMax;
}